

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

void __thiscall cmGlobalNinjaGenerator::AddCustomCommandRule(cmGlobalNinjaGenerator *this)

{
  allocator local_181;
  string local_180;
  allocator local_159;
  string local_158;
  allocator local_131;
  string local_130;
  allocator local_109;
  string local_108;
  allocator local_e1;
  string local_e0;
  allocator local_b9;
  string local_b8;
  allocator local_91;
  string local_90;
  allocator local_69;
  string local_68;
  allocator local_31;
  string local_30;
  cmGlobalNinjaGenerator *local_10;
  cmGlobalNinjaGenerator *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"CUSTOM_COMMAND",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"$COMMAND",&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_90,"$DESC",&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b8,"Rule for running custom commands.",&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e0,"",&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_108,"",&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_130,"",&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_158,"",&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_180,"1",&local_181);
  AddRule(this,&local_30,&local_68,&local_90,&local_b8,&local_e0,&local_108,&local_130,&local_158,
          &local_180,false);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::AddCustomCommandRule()
{
  this->AddRule("CUSTOM_COMMAND",
                "$COMMAND",
                "$DESC",
                "Rule for running custom commands.",
                /*depfile*/ "",
                /*deptype*/ "",
                /*rspfile*/ "",
                /*rspcontent*/ "",
                /*restat*/ "1",
                /*generator*/ false);
}